

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::AffixPatternMatcherBuilder::addMatcher
          (AffixPatternMatcherBuilder *this,NumberParseMatcher *matcher)

{
  int length;
  
  length = this->fMatchersLen;
  if ((this->fMatchers).capacity <= length) {
    MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::resize
              (&this->fMatchers,length * 2,length);
    length = this->fMatchersLen;
  }
  this->fMatchersLen = length + 1;
  (this->fMatchers).ptr[length] = matcher;
  return;
}

Assistant:

void AffixPatternMatcherBuilder::addMatcher(NumberParseMatcher& matcher) {
    if (fMatchersLen >= fMatchers.getCapacity()) {
        fMatchers.resize(fMatchersLen * 2, fMatchersLen);
    }
    fMatchers[fMatchersLen++] = &matcher;
}